

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

void dfheader(FILE *f)

{
  char *__s;
  size_t sVar1;
  FILE *in_RDI;
  char *tstr;
  time_t tm;
  FILE *in_stack_00000280;
  time_t local_10;
  FILE *local_8;
  
  local_8 = in_RDI;
  fputs(start4,in_RDI);
  time(&local_10);
  __s = ctime(&local_10);
  sVar1 = strlen(__s);
  __s[sVar1 - 1] = '\0';
  dfpair((FILE *)local_8,"wall start date","%s",__s);
  walltime();
  dfpair((FILE *)local_8,"wall start time","%g");
  machineid(in_stack_00000280);
  return;
}

Assistant:

void dfheader(FILE *f) {
	fputs(start4, f);

	time_t tm;
	time(&tm);
	char *tstr = ctime(&tm);
	tstr[strlen(tstr)-1] = '\0';
	dfpair(f, "wall start date", "%s", tstr);

	dfpair(f, "wall start time", "%g", walltime());
	machineid(f);
}